

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccnr.cc
# Opt level: O0

int __thiscall CCNR::Mersenne::next(Mersenne *this,int bound)

{
  uint uVar1;
  uint in_ESI;
  uint value;
  
  do {
    uVar1 = next31((Mersenne *)0x163a2f);
  } while (0x7fffffff < uVar1 + in_ESI);
  return uVar1 % in_ESI;
}

Assistant:

int Mersenne::next(int bound)
{
    unsigned int value;
    do {
        value = next31();
    } while (value + (unsigned int)bound >= 0x80000000UL);
    // Just using modulo doesn't lead to uniform distribution. This does.
    return (int)(value % bound);
}